

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O0

void Abc_FlowRetime_PrintInitStateInfo(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pLatch;
  uint local_20;
  int nOther;
  int nDC;
  int n1;
  int n0;
  int i;
  Abc_Ntk_t *pNtk_local;
  
  nDC = 0;
  nOther = 0;
  local_20 = 0;
  pLatch._4_4_ = 0;
  for (n1 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), n1 < iVar1; n1 = n1 + 1) {
    pObj = Abc_NtkBox(pNtk,n1);
    iVar1 = Abc_ObjIsLatch(pObj);
    if (iVar1 != 0) {
      iVar1 = Abc_LatchIsInit0(pObj);
      if (iVar1 == 0) {
        iVar1 = Abc_LatchIsInit1(pObj);
        if (iVar1 == 0) {
          iVar1 = Abc_LatchIsInitDc(pObj);
          if (iVar1 == 0) {
            pLatch._4_4_ = pLatch._4_4_ + 1;
          }
          else {
            local_20 = local_20 + 1;
          }
        }
        else {
          nOther = nOther + 1;
        }
      }
      else {
        nDC = nDC + 1;
      }
    }
  }
  printf("\tinitial states {0,1,x} = {%d, %d, %d}",(ulong)(uint)nDC,(ulong)(uint)nOther,
         (ulong)local_20);
  if (pLatch._4_4_ != 0) {
    printf(" + %d UNKNOWN",(ulong)pLatch._4_4_);
  }
  printf("\n");
  return;
}

Assistant:

void
Abc_FlowRetime_PrintInitStateInfo( Abc_Ntk_t * pNtk ) {
  int i, n0=0, n1=0, nDC=0, nOther=0;
  Abc_Obj_t *pLatch;

  Abc_NtkForEachLatch( pNtk, pLatch, i ) {
    if (Abc_LatchIsInit0(pLatch)) n0++;
    else if (Abc_LatchIsInit1(pLatch)) n1++;
    else if (Abc_LatchIsInitDc(pLatch)) nDC++;
    else nOther++;
  }     

  printf("\tinitial states {0,1,x} = {%d, %d, %d}", n0, n1, nDC);
  if (nOther)
    printf(" + %d UNKNOWN", nOther);
  printf("\n");
}